

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

UnicodeString * icu_63::getDateTimeString(UDate time,UnicodeString *str)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  
  Grego::timeToFields(time,&year,&month,&dom,&dow,&doy,&mid);
  uVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  uVar4 = uVar1 & 0x1e;
  if ((uVar1 & 1) != 0) {
    uVar4 = 2;
  }
  (str->fUnion).fStackFields.fLengthAndFlags = uVar4;
  appendAsciiDigits(year,'\x04',str);
  appendAsciiDigits(month + 1,'\x02',str);
  appendAsciiDigits(dom,'\x02',str);
  UnicodeString::append(str,L'T');
  uVar2 = (ulong)(uint)((int)((long)mid % 3600000) >> 0x1f) << 0x20 |
          (long)mid % 3600000 & 0xffffffffU;
  uVar3 = (long)uVar2 % 60000;
  appendAsciiDigits(mid / 3600000,'\x02',str);
  appendAsciiDigits((int32_t)((long)uVar2 / 60000),'\x02',str);
  appendAsciiDigits((int32_t)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff)
                             / 1000),'\x02',str);
  return str;
}

Assistant:

static UnicodeString& getDateTimeString(UDate time, UnicodeString& str) {
    int32_t year, month, dom, dow, doy, mid;
    Grego::timeToFields(time, year, month, dom, dow, doy, mid);

    str.remove();
    appendAsciiDigits(year, 4, str);
    appendAsciiDigits(month + 1, 2, str);
    appendAsciiDigits(dom, 2, str);
    str.append((UChar)0x0054 /*'T'*/);

    int32_t t = mid;
    int32_t hour = t / U_MILLIS_PER_HOUR;
    t %= U_MILLIS_PER_HOUR;
    int32_t min = t / U_MILLIS_PER_MINUTE;
    t %= U_MILLIS_PER_MINUTE;
    int32_t sec = t / U_MILLIS_PER_SECOND;

    appendAsciiDigits(hour, 2, str);
    appendAsciiDigits(min, 2, str);
    appendAsciiDigits(sec, 2, str);
    return str;
}